

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddFunctionBlocker
          (cmMakefile *this,
          unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *fb)

{
  cmFunctionBlocker *pcVar1;
  cmListFileContext *pcVar2;
  
  if ((this->ExecutionStatusStack).
      super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->ExecutionStatusStack).
      super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar1 = (fb->_M_t).
             super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>._M_t.
             super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
             super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
    pcVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       (&(this->Backtrace).
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    cmListFileContext::operator=(&pcVar1->StartingContext,pcVar2);
  }
  std::
  vector<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>,std::allocator<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>>>
  ::emplace_back<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>>
            ((vector<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>,std::allocator<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>>>
              *)&this->FunctionBlockers,fb);
  return;
}

Assistant:

void cmMakefile::AddFunctionBlocker(std::unique_ptr<cmFunctionBlocker> fb)
{
  if (!this->ExecutionStatusStack.empty()) {
    // Record the context in which the blocker is created.
    fb->SetStartingContext(this->Backtrace.Top());
  }

  this->FunctionBlockers.push(std::move(fb));
}